

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# j2k.c
# Opt level: O0

opj_bool j2k_read_ppt_v2(opj_j2k_v2_t *p_j2k,OPJ_BYTE *p_header_data,OPJ_UINT32 p_header_size,
                        opj_event_mgr *p_manager)

{
  void *pvVar1;
  opj_event_mgr_t *in_RCX;
  int in_EDX;
  OPJ_BYTE *in_RSI;
  long in_RDI;
  OPJ_UINT32 l_Z_ppt;
  opj_tcp_v2_t *l_tcp;
  opj_cp_v2_t *l_cp;
  OPJ_UINT32 local_3c;
  long local_38;
  long local_30;
  opj_event_mgr_t *local_28;
  uint local_1c;
  OPJ_BYTE *local_18;
  opj_bool local_4;
  
  local_30 = 0;
  local_38 = 0;
  if (in_EDX == 0) {
    opj_event_msg_v2(in_RCX,1,"Error reading PPT marker\n");
    local_4 = 0;
  }
  else {
    local_30 = in_RDI + 0x70;
    if ((*(byte *)(in_RDI + 0xf8) & 1) == 0) {
      local_38 = *(long *)(in_RDI + 0xd0) + (ulong)*(uint *)(in_RDI + 0x118) * 0x1630;
      *(byte *)(local_38 + 0x1628) = *(byte *)(local_38 + 0x1628) & 0xfe | 1;
      local_28 = in_RCX;
      local_1c = in_EDX;
      local_18 = in_RSI;
      opj_read_bytes_LE(in_RSI,&local_3c,1);
      local_18 = local_18 + 1;
      local_1c = local_1c - 1;
      if (local_3c == 0) {
        *(undefined4 *)(local_38 + 0x1438) = 0;
        *(uint *)(local_38 + 0x143c) = local_1c;
        pvVar1 = calloc((ulong)*(uint *)(local_38 + 0x143c),1);
        *(void **)(local_38 + 0x1430) = pvVar1;
        if (*(long *)(local_38 + 0x1430) == 0) {
          opj_event_msg_v2(local_28,1,"Not enough memory reading PPT marker\n");
          return 0;
        }
        *(undefined8 *)(local_38 + 0x1428) = *(undefined8 *)(local_38 + 0x1430);
      }
      else {
        *(uint *)(local_38 + 0x143c) = local_1c + *(int *)(local_38 + 0x143c);
        pvVar1 = realloc(*(void **)(local_38 + 0x1430),(ulong)*(uint *)(local_38 + 0x143c));
        *(void **)(local_38 + 0x1430) = pvVar1;
        if (*(long *)(local_38 + 0x1430) == 0) {
          opj_event_msg_v2(local_28,1,"Not enough memory reading PPT marker\n");
          return 0;
        }
        *(undefined8 *)(local_38 + 0x1428) = *(undefined8 *)(local_38 + 0x1430);
        memset((void *)(*(long *)(local_38 + 0x1430) + (ulong)*(uint *)(local_38 + 0x1438)),0,
               (ulong)local_1c);
      }
      memcpy((void *)(*(long *)(local_38 + 0x1430) + (ulong)*(uint *)(local_38 + 0x1438)),local_18,
             (ulong)local_1c);
      *(uint *)(local_38 + 0x1438) = local_1c + *(int *)(local_38 + 0x1438);
      local_4 = 1;
    }
    else {
      opj_event_msg_v2(in_RCX,1,
                       "Error reading PPT marker: packet header have been previously found in the main header (PPM marker).\n"
                      );
      local_4 = 0;
    }
  }
  return local_4;
}

Assistant:

opj_bool j2k_read_ppt_v2 (	opj_j2k_v2_t *p_j2k,
							OPJ_BYTE * p_header_data,
							OPJ_UINT32 p_header_size,
							struct opj_event_mgr * p_manager )
{
	opj_cp_v2_t *l_cp = 00;
	opj_tcp_v2_t *l_tcp = 00;
	OPJ_UINT32 l_Z_ppt;

	/* preconditions */
	assert(p_header_data != 00);
	assert(p_j2k != 00);
	assert(p_manager != 00);

	/* We need to have the Z_ppt element at minimum */
	if (p_header_size < 1) {
		opj_event_msg_v2(p_manager, EVT_ERROR, "Error reading PPT marker\n");
		return OPJ_FALSE;
	}

	l_cp = &(p_j2k->m_cp);
	if (l_cp->ppm){
		opj_event_msg_v2(p_manager, EVT_ERROR, "Error reading PPT marker: packet header have been previously found in the main header (PPM marker).\n");
		return OPJ_FALSE;
	}

	l_tcp = &(l_cp->tcps[p_j2k->m_current_tile_number]);
	l_tcp->ppt = 1;

	opj_read_bytes(p_header_data,&l_Z_ppt,1);		/* Z_ppt */
	++p_header_data;
	--p_header_size;

	/* Allocate buffer to read the packet header */
	if (l_Z_ppt == 0) {
		/* First PPT marker */
		l_tcp->ppt_data_size = 0;
		l_tcp->ppt_len = p_header_size;

		l_tcp->ppt_buffer = (OPJ_BYTE *) opj_calloc(l_tcp->ppt_len, sizeof(OPJ_BYTE) );
		if (l_tcp->ppt_buffer == 00) {
			opj_event_msg_v2(p_manager, EVT_ERROR, "Not enough memory reading PPT marker\n");
			return OPJ_FALSE;
		}
		l_tcp->ppt_data = l_tcp->ppt_buffer;

		/* memset(l_tcp->ppt_buffer,0,l_tcp->ppt_len); */
	}
	else {
		l_tcp->ppt_len += p_header_size;

		l_tcp->ppt_buffer = (OPJ_BYTE *) opj_realloc(l_tcp->ppt_buffer,l_tcp->ppt_len);
		if (l_tcp->ppt_buffer == 00) {
			opj_event_msg_v2(p_manager, EVT_ERROR, "Not enough memory reading PPT marker\n");
			return OPJ_FALSE;
		}
		l_tcp->ppt_data = l_tcp->ppt_buffer;

		memset(l_tcp->ppt_buffer+l_tcp->ppt_data_size,0,p_header_size);
	}

	/* Read packet header from buffer */
	memcpy(l_tcp->ppt_buffer+l_tcp->ppt_data_size,p_header_data,p_header_size);

	l_tcp->ppt_data_size += p_header_size;

	return OPJ_TRUE;
}